

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

void __thiscall
Potassco::ProgramOptions::anon_unknown_15::CommandStringParser::~CommandStringParser
          (CommandStringParser *this)

{
  ~CommandStringParser(this);
  operator_delete(this);
  return;
}

Assistant:

CommandStringParser(const char* cmd, ParseContext& ctx, unsigned flags)
		: CommandLineParser(ctx, flags)
		, cmd_(cmd ? cmd : "") {
		tok_.reserve(80);
	}